

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrinkles.cpp
# Opt level: O1

void __thiscall Wrinkles::apply(Wrinkles *this,Vector *p,SurfaceData *t)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Vector local_60;
  Vector local_48;
  
  dVar3 = 0.0;
  if ((this->amount == 0.0) && (!NAN(this->amount))) {
    return;
  }
  dVar2 = 1.0;
  iVar1 = 10;
  dVar4 = 0.0;
  dVar5 = 0.0;
  do {
    local_60.x = p->x * dVar2;
    local_60.y = p->y * dVar2;
    local_60.z = p->z * dVar2;
    noise_3d(&local_48,&local_60);
    dVar5 = dVar5 + ABS(local_48.x / dVar2);
    dVar4 = dVar4 + ABS(local_48.y / dVar2);
    dVar3 = dVar3 + ABS(local_48.z / dVar2);
    dVar2 = dVar2 + dVar2;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  dVar2 = this->amount;
  dVar5 = dVar5 * dVar2 + (t->n).x;
  (t->n).x = dVar5;
  dVar4 = dVar4 * dVar2 + (t->n).y;
  (t->n).y = dVar4;
  dVar2 = dVar3 * dVar2 + (t->n).z;
  (t->n).z = dVar2;
  dVar3 = dVar2 * dVar2 + dVar5 * dVar5 + dVar4 * dVar4;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  (t->n).x = dVar5 / dVar3;
  (t->n).y = dVar4 / dVar3;
  (t->n).z = dVar2 / dVar3;
  return;
}

Assistant:

void Wrinkles::apply( Vector& p, Grayzer::SurfaceData& t )
{
   Vector result (0.0);
   Vector value;
   double scale = 1.0;
   int   i;

   if(   amount == 0.0 )   return;

   for( i = 0; i <   10;   scale *= 2.0, i++ )
   {
      value =  noise_3d( p * scale  );
      result.x += fabs(value.x / scale);
      result.y += fabs(value.y / scale);
      result.z += fabs(value.z / scale);
   }
   t.n   += result * amount;
   t.n   = normalize( t.n );
}